

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O1

void printToken(char *path,VM *vm,char *sourceCode)

{
  char *pcVar1;
  ulong uVar2;
  parser parser;
  Parser local_c0;
  
  initParser(vm,&local_c0,path,sourceCode,(ObjModule *)0x0);
  if (local_c0.curToken.type != TOKEN_EOF) {
    do {
      getNextToken(&local_c0);
      printf("%dL: %s [",(ulong)local_c0.curToken.lineNo,tokenArray[local_c0.curToken.type]);
      if (local_c0.curToken.length != 0) {
        uVar2 = 0;
        do {
          pcVar1 = local_c0.curToken.start + uVar2;
          uVar2 = uVar2 + 1;
          putchar((int)*pcVar1);
        } while (uVar2 < local_c0.curToken.length);
      }
      puts("]");
    } while (local_c0.curToken.type != TOKEN_EOF);
  }
  return;
}

Assistant:

void printToken(const char *path, const VM *vm, const char *sourceCode) {
    struct parser parser;
    // TODO 模块先临时写NULL
    initParser(vm, &parser, path, sourceCode, NULL);
    while (parser.curToken.type != TOKEN_EOF) {
        getNextToken(&parser);
        printf("%dL: %s [", parser.curToken.lineNo, tokenArray[parser.curToken.type]);
        uint32_t idx = 0;
        while (idx < parser.curToken.length) {
            printf("%c", *(parser.curToken.start + idx++));
        }

        printf("]\n");
    }
}